

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O2

function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> * __thiscall
chaiscript::dispatch::functor<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>
          (function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>
           *__return_storage_ptr__,dispatch *this,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *funcs,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  undefined8 *puVar2;
  Type_Conversions_State *in_R8;
  
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>,chaiscript::dispatch::functor<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>(std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>const&,chaiscript::Type_Conversions_State_const*)::_lambda(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)_1_>
                    (*(undefined8 *)this);
  if (bVar1) {
    detail::build_function_caller_helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>
              (__return_storage_ptr__,(detail *)0x0,(_func_Boxed_Value_Boxed_Value_ptr *)this,funcs,
               in_R8);
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x38);
  *puVar2 = &PTR__bad_cast_00478b08;
  puVar2[1] = &std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>::typeinfo;
  puVar2[2] = &Proxy_Function_Base::typeinfo;
  *(undefined4 *)(puVar2 + 3) = 1;
  puVar2[4] = &std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>::typeinfo;
  puVar2[5] = 0x19;
  puVar2[6] = "Cannot perform boxed_cast";
  __cxa_throw(puVar2,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

std::function<FunctionType> functor(const std::vector<Const_Proxy_Function> &funcs, const Type_Conversions_State *t_conversions) {
      const bool has_arity_match = std::any_of(funcs.begin(), funcs.end(), [](const Const_Proxy_Function &f) {
        return f->get_arity() == -1 || size_t(f->get_arity()) == detail::arity(static_cast<FunctionType *>(nullptr));
      });

      if (!has_arity_match) {
        throw exception::bad_boxed_cast(user_type<Const_Proxy_Function>(), typeid(std::function<FunctionType>));
      }

      FunctionType *p = nullptr;
      return detail::build_function_caller_helper(p, funcs, t_conversions);
    }